

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_eliminate_unused_offset
          (REF_INT nglobal,REF_GLOB *sorted_globals,REF_INT nunused,REF_GLOB *sorted_unused)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  
  if (0 < nglobal) {
    uVar3 = 0;
    iVar4 = 0;
    do {
      iVar1 = iVar4;
      if (iVar4 < nunused) {
        lVar2 = 0;
        do {
          if (sorted_globals[uVar3] <= sorted_unused[iVar4 + lVar2]) {
            iVar1 = iVar4 + (int)lVar2;
            break;
          }
          lVar2 = lVar2 + 1;
          iVar1 = nunused;
        } while ((long)nunused - (long)iVar4 != lVar2);
      }
      iVar4 = iVar1;
      sorted_globals[uVar3] = sorted_globals[uVar3] - (long)iVar4;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)nglobal);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_eliminate_unused_offset(REF_INT nglobal,
                                                    REF_GLOB *sorted_globals,
                                                    REF_INT nunused,
                                                    REF_GLOB *sorted_unused) {
  REF_INT offset;
  REF_INT i;
  offset = 0;
  for (i = 0; i < nglobal; i++) {
    while ((offset < nunused) && (sorted_unused[offset] < sorted_globals[i])) {
      offset++;
    }
    /* assert there are no unused in global list */
    sorted_globals[i] -= (REF_GLOB)offset;
  }

  return REF_SUCCESS;
}